

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O3

int __thiscall
SatPos::CalculateGEOVel
          (double tk,SatPos *this,int prn,undefined8 param_4,double *param_5,undefined8 param_6,
          undefined8 param_7,double SatPosGK,double param_9,double param_10)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector3d V;
  Vector3d left;
  Vector3d right;
  Matrix3d tmp2;
  Matrix3d tmp1;
  Matrix<double,_3,_3> local_d8;
  Matrix<double,_3,_3> local_c8;
  Matrix<double,_3,_3> local_b8;
  undefined1 local_a8 [16];
  Matrix<double,_3,_1> local_98;
  Matrix<double,_3,_1> local_88;
  Matrix<double,_3,_1> local_78;
  Matrix<double,_3,_1> local_68;
  Matrix<double,_3,_1> local_58;
  Matrix<double,_3,_3> local_48;
  Matrix<double,_3,_3> local_38;
  
  local_a8._8_8_ = local_a8._0_8_;
  local_98.rows = 3;
  local_98.cols = 1;
  local_68._0_8_ = param_4;
  local_68.data = param_5;
  local_98.data = (double *)operator_new__(0x18);
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_98,0,0);
  *pdVar3 = SatPosGK;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_98,1,0);
  *pdVar3 = param_9;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_98,2,0);
  *pdVar3 = param_10;
  dVar1 = Deg2Rad(-5.0);
  local_d8.rows = 3;
  local_d8.cols = 3;
  local_d8.data = (double *)operator_new__(0x48);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_d8,0,0);
  *pdVar3 = 1.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_d8,0,1);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_d8,0,2);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_d8,1,0);
  *pdVar3 = 0.0;
  local_a8._0_8_ = cos(dVar1);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_d8,1,1);
  *pdVar3 = (double)local_a8._0_8_;
  local_a8._0_8_ = sin(dVar1);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_d8,1,2);
  *pdVar3 = (double)local_a8._0_8_;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_d8,2,0);
  *pdVar3 = 0.0;
  dVar2 = sin(dVar1);
  local_a8._8_4_ = extraout_XMM0_Dc;
  local_a8._0_8_ = dVar2;
  local_a8._12_4_ = extraout_XMM0_Dd;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_d8,2,1);
  *pdVar3 = -local_a8._0_8_;
  dVar1 = cos(dVar1);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_d8,2,2);
  *pdVar3 = dVar1;
  local_b8.rows = 3;
  local_b8.cols = 3;
  local_b8.data = (double *)operator_new__(0x48);
  tk = tk * 7.292115e-05;
  dVar1 = cos(tk);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_b8,0,0);
  *pdVar3 = dVar1;
  dVar1 = sin(tk);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_b8,0,1);
  *pdVar3 = dVar1;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_b8,0,2);
  *pdVar3 = 0.0;
  dVar1 = sin(tk);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_b8,1,0);
  *pdVar3 = -dVar1;
  dVar1 = cos(tk);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_b8,1,1);
  *pdVar3 = dVar1;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_b8,1,2);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_b8,2,0);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_b8,2,1);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_b8,2,2);
  *pdVar3 = 1.0;
  local_c8.rows = 3;
  local_c8.cols = 3;
  local_c8.data = (double *)operator_new__(0x48);
  dVar1 = sin(tk);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_c8,0,0);
  *pdVar3 = dVar1 * -7.292115e-05;
  dVar1 = cos(tk);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_c8,0,1);
  *pdVar3 = dVar1 * 7.292115e-05;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_c8,0,2);
  *pdVar3 = 0.0;
  dVar1 = cos(tk);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_c8,1,0);
  *pdVar3 = dVar1 * -7.292115e-05;
  dVar1 = sin(tk);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_c8,1,1);
  *pdVar3 = dVar1 * -7.292115e-05;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_c8,1,2);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_c8,2,0);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_c8,2,1);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_c8,2,2);
  *pdVar3 = 0.0;
  local_38 = Matrix<double,3,3>::operator*((Matrix<double,3,3> *)&local_c8,&local_d8);
  local_78 = Matrix<double,3,3>::operator*((Matrix<double,3,3> *)&local_38,&local_98);
  local_48 = Matrix<double,3,3>::operator*((Matrix<double,3,3> *)&local_b8,&local_d8);
  local_58 = Matrix<double,3,3>::operator*((Matrix<double,3,3> *)&local_48,&local_68);
  local_88 = Matrix<double,_3,_1>::operator+(&local_78,&local_58);
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_88,0,0);
  this->Bds[prn].SatVelocity.X = *pdVar3;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_88,1,0);
  this->Bds[prn].SatVelocity.Y = *pdVar3;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_88,2,0);
  this->Bds[prn].SatVelocity.Z = *pdVar3;
  if (local_48.data != (double *)0x0) {
    operator_delete__(local_48.data);
  }
  if (local_38.data != (double *)0x0) {
    operator_delete__(local_38.data);
  }
  if (local_78.data != (double *)0x0) {
    operator_delete__(local_78.data);
  }
  if (local_58.data != (double *)0x0) {
    operator_delete__(local_58.data);
  }
  if (local_88.data != (double *)0x0) {
    operator_delete__(local_88.data);
  }
  if (local_b8.data != (double *)0x0) {
    operator_delete__(local_b8.data);
  }
  if (local_d8.data != (double *)0x0) {
    operator_delete__(local_d8.data);
  }
  if (local_98.data != (double *)0x0) {
    operator_delete__(local_98.data);
  }
  if (local_c8.data != (double *)0x0) {
    operator_delete__(local_c8.data);
  }
  return 0;
}

Assistant:

int SatPos::CalculateGEOVel(const double tk, const XYZ SatPosGK, const int prn, const Matrix<double, 3, 1> velocity, SPPResult result)
{
    try
    {
        Vector3d GK;
        GK(0, 0) = SatPosGK.X;
        GK(1, 0) = SatPosGK.Y;
        GK(2, 0) = SatPosGK.Z;
        // GK(0, 0) = result.BDSPosi[prn].X;
        // GK(1, 0) = result.BDSPosi[prn].Y;
        // GK(2, 0) = result.BDSPosi[prn].Z;

        double Zaxis = BDSROTATIONRATE * tk;
        double Xaxis = Deg2Rad(-5.0);

        Matrix<double, 3, 3> Rx;
        Rx(0, 0) = 1;
        Rx(0, 1) = 0;
        Rx(0, 2) = 0;

        Rx(1, 0) = 0;
        Rx(1, 1) = cos(Xaxis);
        Rx(1, 2) = sin(Xaxis);

        Rx(2, 0) = 0;
        Rx(2, 1) = -sin(Xaxis);
        Rx(2, 2) = cos(Xaxis);

        Matrix<double, 3, 3> Rz;
        Rz(0, 0) = cos(Zaxis);
        Rz(0, 1) = sin(Zaxis);
        Rz(0, 2) = 0;

        Rz(1, 0) = -sin(Zaxis);
        Rz(1, 1) = cos(Zaxis);
        Rz(1, 2) = 0;

        Rz(2, 0) = 0;
        Rz(2, 1) = 0;
        Rz(2, 2) = 1;

        Matrix3d Rzdot;
        Rzdot(0, 0) = -sin(Zaxis) * BDSROTATIONRATE;
        Rzdot(0, 1) = cos(Zaxis) * BDSROTATIONRATE;
        Rzdot(0, 2) = 0;

        Rzdot(1, 0) = -cos(Zaxis) * BDSROTATIONRATE;
        Rzdot(1, 1) = -sin(Zaxis) * BDSROTATIONRATE;
        Rzdot(1, 2) = 0;

        Rzdot(2, 0) = 0;
        Rzdot(2, 1) = 0;
        Rzdot(2, 2) = 0;

        Matrix3d tmp1 = Rzdot * Rx;
        Vector3d left = tmp1 * GK;

        Matrix3d tmp2 = Rz * Rx;
        Vector3d right = tmp2 * velocity;
        Vector3d V = left + right;

        Bds[prn].SatVelocity.X = V(0, 0);
        Bds[prn].SatVelocity.Y = V(1, 0);
        Bds[prn].SatVelocity.Z = V(2, 0);

        tmp2.deleteMatrix();
        tmp1.deleteMatrix();
        left.deleteMatrix();
        right.deleteMatrix();
        V.deleteMatrix();
        Rz.deleteMatrix();
        Rx.deleteMatrix();
        GK.deleteMatrix();
        Rzdot.deleteMatrix();
    }
    catch(...)
    {
        cout << "error happened when calculate GEO vel" << endl;
        return UNKNOWN_ERROR;
    }
    
    return 0;
}